

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_1::Compressed2DTestInstance::Compressed2DTestInstance
          (Compressed2DTestInstance *this,Context *context,ParameterType *testParameters)

{
  CompressedTexFormat CVar1;
  TestTexture2D *this_00;
  ParameterType *testParameters_local;
  Context *context_local;
  Compressed2DTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Compressed2DTestInstance_016b5650;
  this->m_testParameters = testParameters;
  CVar1 = ::vk::mapVkCompressedFormat
                    ((testParameters->super_Texture2DTestCaseParameters).
                     super_TextureCommonTestCaseParameters.format);
  this->m_compressedFormat = CVar1;
  this_00 = (TestTexture2D *)operator_new(0x70);
  vkt::pipeline::TestTexture2D::TestTexture2D
            (this_00,&this->m_compressedFormat,
             (testParameters->super_Texture2DTestCaseParameters).width,
             (testParameters->super_Texture2DTestCaseParameters).height);
  de::SharedPtr<vkt::pipeline::TestTexture2D>::SharedPtr(&this->m_texture,this_00);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture2DTestCaseParameters).
             super_TextureCommonTestCaseParameters.sampleCount,
             (testParameters->super_Texture2DTestCaseParameters).width,
             (testParameters->super_Texture2DTestCaseParameters).height);
  util::TextureRenderer::add2DTexture(&this->m_renderer,&this->m_texture);
  return;
}

Assistant:

Compressed2DTestInstance::Compressed2DTestInstance (Context&				context,
													const ParameterType&	testParameters)
	: TestInstance			(context)
	, m_testParameters		(testParameters)
	, m_compressedFormat	(mapVkCompressedFormat(testParameters.format))
	, m_texture				(TestTexture2DSp(new pipeline::TestTexture2D(m_compressedFormat, testParameters.width, testParameters.height)))
	, m_renderer			(context, testParameters.sampleCount, testParameters.width, testParameters.height)
{
	m_renderer.add2DTexture(m_texture);
}